

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O2

uint32_t X509_get_extended_key_usage(X509 *x)

{
  int iVar1;
  uint32_t uVar2;
  
  iVar1 = x509v3_cache_extensions(x);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else if ((x->ex_flags & 4) == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = x->ex_xkusage;
  }
  return uVar2;
}

Assistant:

uint32_t X509_get_extended_key_usage(X509 *x) {
  if (!x509v3_cache_extensions(x)) {
    return 0;
  }
  if (x->ex_flags & EXFLAG_XKUSAGE) {
    return x->ex_xkusage;
  }
  // If there is no extension, extended key usage is unconstrained, so set all
  // bits to one.
  return UINT32_MAX;
}